

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

BOOL Js::JavascriptObject::GetOwnPropertyDescriptorHelper
               (RecyclableObject *obj,PropertyId propertyId,ScriptContext *scriptContext,
               PropertyDescriptor *propertyDescriptor)

{
  BOOL BVar1;
  int iVar2;
  BOOL local_30;
  BOOL local_2c;
  BOOL isPropertyDescriptorDefined;
  PropertyDescriptor *propertyDescriptor_local;
  ScriptContext *scriptContext_local;
  PropertyId propertyId_local;
  RecyclableObject *obj_local;
  
  BVar1 = RecyclableObject::IsExternal(obj);
  if (BVar1 == 0) {
    local_2c = Js::JavascriptOperators::GetOwnPropertyDescriptor
                         (obj,propertyId,scriptContext,propertyDescriptor);
  }
  else {
    iVar2 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)(uint)propertyId);
    if (iVar2 == 0) {
      local_30 = 0;
    }
    else {
      local_30 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                           (obj,propertyId,scriptContext,propertyDescriptor);
    }
    local_2c = local_30;
  }
  return local_2c;
}

Assistant:

BOOL JavascriptObject::GetOwnPropertyDescriptorHelper(RecyclableObject* obj, PropertyId propertyId, ScriptContext* scriptContext, PropertyDescriptor& propertyDescriptor)
{
    BOOL isPropertyDescriptorDefined;
    if (obj->IsExternal())
    {
        isPropertyDescriptorDefined = obj->HasOwnProperty(propertyId) ?
            JavascriptOperators::GetOwnPropertyDescriptor(obj, propertyId, scriptContext, &propertyDescriptor) :
            FALSE;
    }
    else
    {
        isPropertyDescriptorDefined = JavascriptOperators::GetOwnPropertyDescriptor(obj, propertyId, scriptContext, &propertyDescriptor);
    }
    return isPropertyDescriptorDefined;
}